

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_sanitize_twod(REF_GRID ref_grid)

{
  int iVar1;
  REF_NODE ref_node;
  size_t __size;
  uint uVar2;
  REF_DBL *metric;
  REF_DBL *metric_00;
  REF_DBL *metric_01;
  undefined8 uVar3;
  REF_STATUS RVar4;
  long lVar5;
  char *pcVar6;
  
  ref_node = ref_grid->node;
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x4dc,
           "ref_metric_sanitize_twod","malloc metric_orig of REF_DBL negative");
    RVar4 = 1;
  }
  else {
    __size = (ulong)(uint)ref_node->max * 0x30;
    metric = (REF_DBL *)malloc(__size);
    if (metric == (REF_DBL *)0x0) {
      pcVar6 = "malloc metric_orig of REF_DBL NULL";
      uVar3 = 0x4dc;
    }
    else {
      metric_00 = (REF_DBL *)malloc(__size);
      if (metric_00 == (REF_DBL *)0x0) {
        pcVar6 = "malloc metric_imply of REF_DBL NULL";
        uVar3 = 0x4dd;
      }
      else {
        metric_01 = (REF_DBL *)malloc(__size);
        if (metric_01 != (REF_DBL *)0x0) {
          uVar2 = ref_metric_from_node(metric,ref_node);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x4e0,"ref_metric_sanitize_twod",(ulong)uVar2,"from");
            return uVar2;
          }
          iVar1 = ref_node->max;
          if (0 < (long)iVar1) {
            lVar5 = 0;
            do {
              *(undefined8 *)((long)metric + lVar5 + 0x10) = 0;
              *(undefined8 *)((long)metric + lVar5 + 0x20) = 0;
              *(undefined8 *)((long)metric + lVar5 + 0x28) = 0x3ff0000000000000;
              lVar5 = lVar5 + 0x30;
            } while ((long)iVar1 * 0x30 != lVar5);
          }
          uVar2 = ref_metric_imply_from(metric_00,ref_grid);
          if (uVar2 == 0) {
            iVar1 = ref_node->max;
            if (0 < (long)iVar1) {
              lVar5 = 0;
              do {
                *(undefined8 *)((long)metric_00 + lVar5 + 8) = 0;
                *(undefined8 *)((long)metric_00 + lVar5 + 0x18) = 0x3ff0000000000000;
                *(undefined8 *)((long)metric_00 + lVar5 + 0x20) = 0;
                lVar5 = lVar5 + 0x30;
              } while ((long)iVar1 * 0x30 != lVar5);
            }
            uVar2 = ref_metric_smr(metric_00,metric,metric_01,ref_grid);
            if (uVar2 == 0) {
              uVar2 = ref_metric_to_node(metric_01,ref_grid->node);
              if (uVar2 == 0) {
                free(metric_01);
                free(metric_00);
                free(metric);
                return 0;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x4f0,"ref_metric_sanitize_twod",(ulong)uVar2,"to");
              return uVar2;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x4ee,"ref_metric_sanitize_twod",(ulong)uVar2,"smr");
            return uVar2;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x4e7,"ref_metric_sanitize_twod",(ulong)uVar2,"imply");
          return uVar2;
        }
        pcVar6 = "malloc metric of REF_DBL NULL";
        uVar3 = 0x4de;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar3,
           "ref_metric_sanitize_twod",pcVar6);
    RVar4 = 2;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_sanitize_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *metric_orig;
  REF_DBL *metric_imply;
  REF_DBL *metric;
  REF_INT node;

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(metric, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  RSS(ref_metric_from_node(metric_orig, ref_grid_node(ref_grid)), "from");
  for (node = 0; node < ref_node_max(ref_node); node++) {
    metric_orig[2 + 6 * node] = 0.0;
    metric_orig[4 + 6 * node] = 0.0;
    metric_orig[5 + 6 * node] = 1.0;
  }

  RSS(ref_metric_imply_from(metric_imply, ref_grid), "imply");
  for (node = 0; node < ref_node_max(ref_node); node++) {
    metric_imply[1 + 6 * node] = 0.0;
    metric_imply[3 + 6 * node] = 1.0;
    metric_imply[4 + 6 * node] = 0.0;
  }

  RSS(ref_metric_smr(metric_imply, metric_orig, metric, ref_grid), "smr");

  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "to");

  ref_free(metric);
  ref_free(metric_imply);
  ref_free(metric_orig);

  return REF_SUCCESS;
}